

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

bool __thiscall testing::internal::DeathTestImpl::Passed(DeathTestImpl *this,bool status_ok)

{
  uint uVar1;
  void *pvVar2;
  int iVar3;
  size_t sVar4;
  uint uVar5;
  ostream *poVar6;
  stringstream *psVar7;
  char *pcVar8;
  long lVar9;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar10;
  bool bVar11;
  Message buffer;
  regmatch_t match;
  String error_message;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  string local_90;
  char *local_70;
  long local_68;
  string local_60;
  void *local_40;
  long local_38;
  
  if (this->spawned_ != true) {
    return false;
  }
  GetCapturedStream((internal *)&local_70,(CapturedStream **)&g_captured_stderr);
  Message::Message((Message *)&local_98);
  poVar6 = (ostream *)(local_98.ptr_ + 0x10);
  if (local_98.ptr_ ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    poVar6 = (ostream *)0x0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Death test: ",0xc);
  pcVar8 = this->statement_;
  if (pcVar8 == (char *)0x0) {
    sVar10.ptr_ = local_98.ptr_ + 0x10;
    sVar4 = 6;
    pcVar8 = "(null)";
  }
  else {
    sVar10.ptr_ = local_98.ptr_;
    if (local_98.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      sVar10.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_98.ptr_ + 0x10);
    }
    sVar4 = strlen(pcVar8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)sVar10.ptr_,pcVar8,sVar4);
  poVar6 = (ostream *)(local_98.ptr_ + 0x10);
  if (local_98.ptr_ ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    poVar6 = (ostream *)0x0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  switch(this->outcome_) {
  case DIED:
    if (status_ok) {
      if (this->regex_[8] == (RE)0x1) {
        iVar3 = regexec((regex_t *)(this->regex_ + 0x50),local_70,1,(regmatch_t *)&local_90,0);
        bVar11 = iVar3 == 0;
      }
      else {
        bVar11 = false;
      }
      if (bVar11 == false) {
        poVar6 = (ostream *)(local_98.ptr_ + 0x10);
        if (local_98.ptr_ ==
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          poVar6 = (ostream *)0x0;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,"    Result: died but not with expected error.\n",0x2e);
        poVar6 = (ostream *)(local_98.ptr_ + 0x10);
        if (local_98.ptr_ ==
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          poVar6 = (ostream *)0x0;
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  Expected: ",0xc);
        pcVar8 = *(char **)this->regex_;
        if (pcVar8 == (char *)0x0) {
          sVar10.ptr_ = local_98.ptr_ + 0x10;
          sVar4 = 6;
          pcVar8 = "(null)";
        }
        else {
          sVar10.ptr_ = local_98.ptr_;
          if (local_98.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            sVar10.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *
                          )(local_98.ptr_ + 0x10);
          }
          sVar4 = strlen(pcVar8);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)sVar10.ptr_,pcVar8,sVar4);
        poVar6 = (ostream *)(local_98.ptr_ + 0x10);
        if (local_98.ptr_ ==
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          poVar6 = (ostream *)0x0;
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        poVar6 = (ostream *)(local_98.ptr_ + 0x10);
        if (local_98.ptr_ ==
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          poVar6 = (ostream *)0x0;
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Actual msg:\n",0xc);
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_60,local_70,local_70 + local_68);
        FormatDeathTestOutput(&local_90,&local_60);
        poVar6 = (ostream *)(local_98.ptr_ + 0x10);
        if (local_98.ptr_ ==
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          poVar6 = (ostream *)0x0;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,local_90._M_dataplus._M_p,local_90._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p);
        }
      }
      goto LAB_00115f10;
    }
    poVar6 = (ostream *)(local_98.ptr_ + 0x10);
    if (local_98.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar6 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"    Result: died but not with expected exit code:\n",0x32);
    poVar6 = (ostream *)(local_98.ptr_ + 0x10);
    if (local_98.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar6 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"            ",0xc);
    uVar1 = this->status_;
    Message::Message((Message *)&local_90);
    uVar5 = uVar1 & 0x7f;
    if (uVar5 == 0) {
      poVar6 = (ostream *)(local_90._M_dataplus._M_p + 0x10);
      if ((stringstream *)local_90._M_dataplus._M_p == (stringstream *)0x0) {
        poVar6 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Exited with exit status ",0x18);
      psVar7 = (stringstream *)(local_90._M_dataplus._M_p + 0x10);
      if ((stringstream *)local_90._M_dataplus._M_p == (stringstream *)0x0) {
        psVar7 = (stringstream *)0x0;
      }
      std::ostream::operator<<(psVar7,uVar1 >> 8 & 0xff);
    }
    else if (0x1ffffff < (int)(uVar5 * 0x1000000 + 0x1000000)) {
      poVar6 = (ostream *)(local_90._M_dataplus._M_p + 0x10);
      if ((stringstream *)local_90._M_dataplus._M_p == (stringstream *)0x0) {
        poVar6 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Terminated by signal ",0x15);
      psVar7 = (stringstream *)(local_90._M_dataplus._M_p + 0x10);
      if ((stringstream *)local_90._M_dataplus._M_p == (stringstream *)0x0) {
        psVar7 = (stringstream *)0x0;
      }
      std::ostream::operator<<(psVar7,uVar5);
    }
    if ((char)uVar1 < '\0') {
      poVar6 = (ostream *)(local_90._M_dataplus._M_p + 0x10);
      if ((stringstream *)local_90._M_dataplus._M_p == (stringstream *)0x0) {
        poVar6 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," (core dumped)",0xe);
    }
    StringStreamToString((internal *)&local_40,(stringstream *)local_90._M_dataplus._M_p);
    if ((stringstream *)local_90._M_dataplus._M_p != (stringstream *)0x0) {
      (**(code **)(*(long *)local_90._M_dataplus._M_p + 8))();
      local_90._M_dataplus._M_p = (pointer)0x0;
    }
    pvVar2 = local_40;
    poVar6 = (ostream *)(local_98.ptr_ + 0x10);
    if (local_98.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar6 = (ostream *)0x0;
    }
    if (local_40 == (void *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"(null)",6);
    }
    else if (local_38 != 0) {
      lVar9 = 0;
      do {
        if (*(char *)((long)pvVar2 + lVar9) == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\\0",2);
        }
        else {
          local_90._M_dataplus._M_p._0_1_ = *(char *)((long)pvVar2 + lVar9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_90,1);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != local_38);
    }
    poVar6 = (ostream *)(local_98.ptr_ + 0x10);
    if (local_98.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar6 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    poVar6 = (ostream *)(local_98.ptr_ + 0x10);
    if (local_98.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar6 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Actual msg:\n",0xc);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,local_70,local_70 + local_68);
    FormatDeathTestOutput(&local_90,&local_60);
    poVar6 = (ostream *)(local_98.ptr_ + 0x10);
    if (local_98.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar6 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,local_90._M_dataplus._M_p,local_90._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if (local_40 != (void *)0x0) {
      operator_delete__(local_40);
    }
    goto LAB_00115f0e;
  case LIVED:
    poVar6 = (ostream *)(local_98.ptr_ + 0x10);
    if (local_98.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar6 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    Result: failed to die.\n",0x1b);
    poVar6 = (ostream *)(local_98.ptr_ + 0x10);
    if (local_98.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar6 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," Error msg:\n",0xc);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,local_70,local_70 + local_68);
    FormatDeathTestOutput(&local_90,&local_60);
    poVar6 = (ostream *)(local_98.ptr_ + 0x10);
    if (local_98.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar6 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,local_90._M_dataplus._M_p,local_90._M_string_length);
    break;
  case RETURNED:
    poVar6 = (ostream *)(local_98.ptr_ + 0x10);
    if (local_98.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar6 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"    Result: illegal return in test statement.\n",0x2e);
    poVar6 = (ostream *)(local_98.ptr_ + 0x10);
    if (local_98.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar6 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," Error msg:\n",0xc);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,local_70,local_70 + local_68);
    FormatDeathTestOutput(&local_90,&local_60);
    poVar6 = (ostream *)(local_98.ptr_ + 0x10);
    if (local_98.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar6 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,local_90._M_dataplus._M_p,local_90._M_string_length);
    break;
  case THREW:
    poVar6 = (ostream *)(local_98.ptr_ + 0x10);
    if (local_98.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar6 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"    Result: threw an exception.\n",0x20);
    poVar6 = (ostream *)(local_98.ptr_ + 0x10);
    if (local_98.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar6 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," Error msg:\n",0xc);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,local_70,local_70 + local_68);
    FormatDeathTestOutput(&local_90,&local_60);
    poVar6 = (ostream *)(local_98.ptr_ + 0x10);
    if (local_98.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar6 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,local_90._M_dataplus._M_p,local_90._M_string_length);
    break;
  default:
    GTestLog::GTestLog((GTestLog *)&local_90,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/googletest/src/gtest-death-test.cc"
                       ,0x213);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DeathTest::Passed somehow called before conclusion of test",
               0x3a);
    GTestLog::~GTestLog((GTestLog *)&local_90);
    goto LAB_00115f0e;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
LAB_00115f0e:
  bVar11 = false;
LAB_00115f10:
  StringStreamToString((internal *)&local_90,local_98.ptr_);
  String::operator=((String *)&DeathTest::last_death_test_message_,(String *)&local_90);
  if ((stringstream *)local_90._M_dataplus._M_p != (stringstream *)0x0) {
    operator_delete__(local_90._M_dataplus._M_p);
  }
  if (local_98.ptr_ != (stringstream *)0x0) {
    (**(code **)(*(long *)local_98.ptr_ + 8))();
    local_98.ptr_ = (stringstream *)0x0;
  }
  if (local_70 != (char *)0x0) {
    operator_delete__(local_70);
  }
  return bVar11;
}

Assistant:

bool DeathTestImpl::Passed(bool status_ok) {
  if (!spawned())
    return false;

  const String error_message = GetCapturedStderr();

  bool success = false;
  Message buffer;

  buffer << "Death test: " << statement() << "\n";
  switch (outcome()) {
    case LIVED:
      buffer << "    Result: failed to die.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case THREW:
      buffer << "    Result: threw an exception.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case RETURNED:
      buffer << "    Result: illegal return in test statement.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case DIED:
      if (status_ok) {
        const bool matched = RE::PartialMatch(error_message.c_str(), *regex());
        if (matched) {
          success = true;
        } else {
          buffer << "    Result: died but not with expected error.\n"
                 << "  Expected: " << regex()->pattern() << "\n"
                 << "Actual msg:\n" << FormatDeathTestOutput(error_message);
        }
      } else {
        buffer << "    Result: died but not with expected exit code:\n"
               << "            " << ExitSummary(status()) << "\n"
               << "Actual msg:\n" << FormatDeathTestOutput(error_message);
      }
      break;
    case IN_PROGRESS:
    default:
      GTEST_LOG_(FATAL)
          << "DeathTest::Passed somehow called before conclusion of test";
  }

  DeathTest::set_last_death_test_message(buffer.GetString());
  return success;
}